

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-misc.cc
# Opt level: O3

void pause_if_needed(void)

{
  return;
}

Assistant:

void pause_if_needed() {
#ifdef _WIN32
    // For Windows, prompt for a keystroke before the Gnuplot object goes out of scope so that
    // the gnuplot window doesn't get closed.
    std::cout << "Press enter to exit." << std::endl;
    std::cin.get();
#endif
}